

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompStep(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  xmlXPathContextPtr ctxt_00;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  xmlChar *str1;
  byte *pbVar5;
  xmlChar *prefix;
  xmlChar *pxVar6;
  char cVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  uint value;
  uint uVar12;
  uint uStackY_60;
  int local_3c;
  int local_38;
  
  uVar11 = 4;
  pbVar5 = ctxt->cur;
  while( true ) {
    pbVar4 = pbVar5 + 1;
    uVar9 = (ulong)*pbVar5;
    if (0x2e < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x2a) goto LAB_001bb277;
      if (uVar9 == 0x2e) {
        if (*pbVar4 != 0x2e) {
          while( true ) {
            ctxt->cur = pbVar4;
            if (0x20 < (ulong)*pbVar4) {
              return;
            }
            if ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0) break;
            pbVar4 = pbVar4 + 1;
          }
          return;
        }
        goto LAB_001bb187;
      }
      break;
    }
    ctxt->cur = pbVar4;
    pbVar5 = pbVar4;
  }
  str1 = xmlXPathParseNCName(ctxt);
  if (str1 == (xmlChar *)0x0) {
    if (*ctxt->cur == '@') {
      ctxt->cur = ctxt->cur + 1;
      uVar11 = 3;
    }
LAB_001bb277:
    str1 = (xmlChar *)0x0;
    value = uVar11;
    goto switchD_001bb215_caseD_62;
  }
  xVar1 = *str1;
  value = uVar11;
  switch(xVar1) {
  case 'a':
    iVar2 = xmlStrEqual(str1,(xmlChar *)"ancestor");
    iVar3 = xmlStrEqual(str1,(xmlChar *)"ancestor-or-self");
    uStackY_60 = 2;
    if (iVar3 == 0) {
      uStackY_60 = (uint)(iVar2 != 0);
    }
    iVar2 = xmlStrEqual(str1,"attribute");
    if (iVar2 == 0) {
LAB_001bb57c:
      if (uStackY_60 == 0) goto switchD_001bb215_caseD_62;
    }
    else {
      uStackY_60 = 3;
    }
    break;
  case 'b':
  case 'e':
    goto switchD_001bb215_caseD_62;
  case 'c':
    iVar2 = xmlStrEqual(str1,"child");
    value = 4;
    uStackY_60 = value;
    if (iVar2 != 0) break;
    goto switchD_001bb215_caseD_62;
  case 'd':
    iVar2 = xmlStrEqual(str1,(xmlChar *)"descendant");
    iVar3 = xmlStrEqual(str1,(xmlChar *)"descendant-or-self");
    if (iVar3 == 0) {
      uStackY_60 = (uint)(iVar2 != 0) * 5;
      goto LAB_001bb57c;
    }
    uStackY_60 = 6;
    break;
  case 'f':
    iVar2 = xmlStrEqual(str1,(xmlChar *)"following");
    uStackY_60 = 7;
    if (iVar2 == 0) {
      uStackY_60 = 0;
    }
    iVar2 = xmlStrEqual(str1,(xmlChar *)"following-sibling");
    if (iVar2 == 0) goto LAB_001bb57c;
    uStackY_60 = 8;
    break;
  default:
    if (xVar1 == 'n') {
      iVar2 = xmlStrEqual(str1,"namespace");
      if (iVar2 == 0) goto switchD_001bb215_caseD_62;
      uStackY_60 = 9;
    }
    else if (xVar1 == 'p') {
      iVar2 = xmlStrEqual(str1,(xmlChar *)"parent");
      uVar12 = 10;
      if (iVar2 == 0) {
        uVar12 = 0;
      }
      iVar2 = xmlStrEqual(str1,(xmlChar *)"preceding");
      uStackY_60 = 0xb;
      if (iVar2 == 0) {
        uStackY_60 = uVar12;
      }
      iVar2 = xmlStrEqual(str1,(xmlChar *)"preceding-sibling");
      if (iVar2 == 0) goto LAB_001bb57c;
      uStackY_60 = 0xc;
    }
    else {
      if ((xVar1 != 's') || (iVar2 = xmlStrEqual(str1,"self"), iVar2 == 0))
      goto switchD_001bb215_caseD_62;
      uStackY_60 = 0xd;
    }
  }
  pbVar5 = ctxt->cur;
  while( true ) {
    pbVar4 = pbVar5 + 1;
    uVar9 = (ulong)*pbVar5;
    value = uVar11;
    if (0x3a < uVar9) break;
    if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
      if ((uVar9 == 0x3a) && (*pbVar4 == 0x3a)) {
        ctxt->cur = pbVar5 + 2;
        (*xmlFree)(str1);
        str1 = (xmlChar *)0x0;
        value = uStackY_60;
      }
      break;
    }
    ctxt->cur = pbVar4;
    pbVar5 = pbVar4;
  }
switchD_001bb215_caseD_62:
  if (ctxt->error != 0) goto LAB_001bb28a;
  pbVar5 = ctxt->cur;
  while( true ) {
    uVar9 = (ulong)*pbVar5;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
    ctxt->cur = pbVar5;
  }
  if (*pbVar5 == 0x2a && str1 == (xmlChar *)0x0) {
    ctxt->cur = pbVar5 + 1;
    local_3c = 3;
    prefix = (xmlChar *)0x0;
    local_38 = 0;
LAB_001bb667:
    str1 = prefix;
    prefix = (xmlChar *)0x0;
  }
  else {
    prefix = str1;
    if (str1 == (xmlChar *)0x0) {
      prefix = xmlXPathParseNCName(ctxt);
      if (prefix == (xmlChar *)0x0) {
LAB_001bb759:
        xmlXPathErr(ctxt,7);
        return;
      }
      pbVar5 = ctxt->cur;
      uVar9 = (ulong)*pbVar5;
    }
    cVar7 = (char)uVar9;
    if (cVar7 == ' ') {
      bVar10 = false;
    }
    else {
      bVar10 = cVar7 != '\r' && (byte)(cVar7 - 0xbU) < 0xfe;
    }
LAB_001bb366:
    pbVar4 = pbVar5 + 1;
    if ((byte)uVar9 < 0x29) {
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001bb361;
      if (uVar9 == 0x28) {
        local_38 = 7;
        ctxt->cur = pbVar4;
        iVar2 = xmlStrEqual(prefix,"comment");
        bVar10 = false;
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(prefix,"node");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(prefix,(xmlChar *)"processing-instruction");
            bVar10 = true;
            if (iVar2 == 0) {
              iVar2 = xmlStrEqual(prefix,"text");
              if (iVar2 != 0) {
                local_38 = 3;
                goto LAB_001bb3a2;
              }
              (*xmlFree)(prefix);
              goto LAB_001bb759;
            }
          }
          else {
            local_38 = 0;
          }
        }
        else {
          local_38 = 8;
LAB_001bb3a2:
          bVar10 = false;
        }
        pbVar5 = ctxt->cur;
        while( true ) {
          bVar8 = *pbVar5;
          if ((0x20 < (ulong)bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
          pbVar5 = pbVar5 + 1;
          ctxt->cur = pbVar5;
        }
        if (bVar10) {
          (*xmlFree)(prefix);
          pbVar5 = ctxt->cur;
          if (*pbVar5 != 0x29) {
            prefix = xmlXPathParseLiteral(ctxt);
            pbVar5 = ctxt->cur;
            uStackY_60 = 2;
            while( true ) {
              bVar8 = *pbVar5;
              local_3c = uStackY_60;
              if ((0x20 < (ulong)bVar8) ||
                 (local_3c = 2, (0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
              pbVar5 = pbVar5 + 1;
              ctxt->cur = pbVar5;
            }
            goto LAB_001bb634;
          }
          local_3c = 1;
          prefix = (xmlChar *)0x0;
LAB_001bb63d:
          ctxt->cur = pbVar5 + 1;
        }
        else {
          local_3c = 1;
LAB_001bb634:
          if (bVar8 == 0x29) goto LAB_001bb63d;
          if (prefix != (xmlChar *)0x0) {
            (*xmlFree)(prefix);
          }
          xmlXPathErr(ctxt,8);
          prefix = (xmlChar *)0x0;
        }
        goto LAB_001bb667;
      }
    }
    if (!bVar10 || (byte)uVar9 != 0x3a) {
      local_38 = 0;
      local_3c = 5;
      goto LAB_001bb667;
    }
    local_38 = 0;
    ctxt->cur = pbVar4;
    if (*pbVar4 == 0x2a) {
      ctxt->cur = pbVar5 + 2;
      local_3c = 3;
LAB_001bb537:
      str1 = (xmlChar *)0x0;
    }
    else {
      str1 = xmlXPathParseNCName(ctxt);
      local_3c = 5;
      if (str1 == (xmlChar *)0x0) {
        xmlXPathErr(ctxt,7);
        goto LAB_001bb537;
      }
    }
    ctxt_00 = ctxt->context;
    if (((ctxt_00 != (xmlXPathContextPtr)0x0) && ((ctxt_00->flags & 1) != 0)) &&
       (pxVar6 = xmlXPathNsLookup(ctxt_00,prefix), pxVar6 == (xmlChar *)0x0)) {
      xmlXPathErr(ctxt,0x13);
    }
  }
  iVar2 = ctxt->comp->last;
  ctxt->comp->last = -1;
  pbVar5 = ctxt->cur;
  while( true ) {
    uVar9 = (ulong)*pbVar5;
    if ((0x20 < uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  }
  while ((char)uVar9 == '[') {
    xmlXPathCompPredicate(ctxt,0);
    uVar9 = (ulong)*ctxt->cur;
  }
  iVar2 = xmlXPathCompExprAdd(ctxt,iVar2,ctxt->comp->last,XPATH_OP_COLLECT,value,local_3c,local_38,
                              prefix,str1);
  if (iVar2 != -1) {
    return;
  }
  (*xmlFree)(prefix);
LAB_001bb28a:
  (*xmlFree)(str1);
  return;
LAB_001bb361:
  ctxt->cur = pbVar4;
  uVar9 = (ulong)*pbVar4;
  pbVar5 = pbVar4;
  goto LAB_001bb366;
  while ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0) {
LAB_001bb187:
    pbVar4 = pbVar4 + 1;
    ctxt->cur = pbVar4;
    if (0x20 < (ulong)*pbVar4) break;
  }
  xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,10,1,0,(void *)0x0,(void *)0x0);
  return;
}

Assistant:

static void
xmlXPathCompStep(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '.') && (NXT(1) == '.')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_PARENT,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '.') {
	NEXT;
	SKIP_BLANKS;
    } else {
	xmlChar *name = NULL;
	xmlChar *prefix = NULL;
	xmlXPathTestVal test = (xmlXPathTestVal) 0;
	xmlXPathAxisVal axis = (xmlXPathAxisVal) 0;
	xmlXPathTypeVal type = (xmlXPathTypeVal) 0;
	int op1;

	if (CUR == '*') {
	    axis = AXIS_CHILD;
	} else {
	    if (name == NULL)
		name = xmlXPathParseNCName(ctxt);
	    if (name != NULL) {
		axis = xmlXPathIsAxisName(name);
		if (axis != 0) {
		    SKIP_BLANKS;
		    if ((CUR == ':') && (NXT(1) == ':')) {
			SKIP(2);
			xmlFree(name);
			name = NULL;
		    } else {
			/* an element name can conflict with an axis one :-\ */
			axis = AXIS_CHILD;
		    }
		} else {
		    axis = AXIS_CHILD;
		}
	    } else if (CUR == '@') {
		NEXT;
		axis = AXIS_ATTRIBUTE;
	    } else {
		axis = AXIS_CHILD;
	    }
	}

        if (ctxt->error != XPATH_EXPRESSION_OK) {
            xmlFree(name);
            return;
        }

	name = xmlXPathCompNodeTest(ctxt, &test, &type, &prefix, name);
	if (test == 0)
	    return;

        if ((prefix != NULL) && (ctxt->context != NULL) &&
	    (ctxt->context->flags & XML_XPATH_CHECKNS)) {
	    if (xmlXPathNsLookup(ctxt->context, prefix) == NULL) {
		xmlXPathErr(ctxt, XPATH_UNDEF_PREFIX_ERROR);
	    }
	}

	op1 = ctxt->comp->last;
	ctxt->comp->last = -1;

	SKIP_BLANKS;
	while (CUR == '[') {
	    xmlXPathCompPredicate(ctxt, 0);
	}

        if (PUSH_FULL_EXPR(XPATH_OP_COLLECT, op1, ctxt->comp->last, axis,
                           test, type, (void *)prefix, (void *)name) == -1) {
            xmlFree(prefix);
            xmlFree(name);
        }
    }
}